

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O2

void __thiscall btDbvtNodeEnumerator::Process(btDbvtNodeEnumerator *this,btDbvtNode *n)

{
  btDbvtNode *local_8;
  
  local_8 = n;
  btAlignedObjectArray<const_btDbvtNode_*>::push_back(&this->nodes,&local_8);
  return;
}

Assistant:

void Process(const btDbvtNode* n) { nodes.push_back(n); }